

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
::
emplace_new_key<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
          *key)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  char *pcVar3;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
  sVar4;
  long lVar5;
  SyntaxNode *pSVar6;
  EntryPointer psVar7;
  EntryPointer psVar8;
  char cVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_bool>
  pVar12;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  local_48;
  size_t local_28;
  char *pcStack_20;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
       )distance_from_desired)) {
    pSVar6 = (SyntaxNode *)(*(long *)(this + 0x20) + 1);
    auVar10._8_4_ = (int)((ulong)pSVar6 >> 0x20);
    auVar10._0_8_ = pSVar6;
    auVar10._12_4_ = 0x45300000;
    lVar5 = *(long *)(this + 0x10) + 1;
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    if ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)pSVar6) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) {
      cVar9 = current_entry->distance_from_desired;
      if (cVar9 < '\0') {
        (current_entry->field_1).value.second = key->second;
        pcVar3 = (key->first)._M_str;
        (current_entry->field_1).value.first._M_len = (key->first)._M_len;
        (current_entry->field_1).value.first._M_str = pcVar3;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pSVar1 = key->second;
        sVar2 = (key->first)._M_len;
        pcVar3 = (key->first)._M_str;
        current_entry->distance_from_desired = distance_from_desired;
        local_48.first._M_len = (current_entry->field_1).value.first._M_len;
        local_48.first._M_str = (current_entry->field_1).value.first._M_str;
        (current_entry->field_1).value.first._M_len = sVar2;
        (current_entry->field_1).value.first._M_str = pcVar3;
        pSVar6 = (current_entry->field_1).value.second;
        (current_entry->field_1).value.second = pSVar1;
        sVar4 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
                 )(cVar9 + '\x01');
        psVar7 = current_entry + 1;
        cVar9 = current_entry[1].distance_from_desired;
        psVar8 = current_entry;
        if (-1 < cVar9) {
          do {
            psVar8 = psVar7;
            if (cVar9 < (char)sVar4) {
              psVar8->distance_from_desired = (int8_t)sVar4;
              sVar2 = (psVar8->field_1).value.first._M_len;
              pcVar3 = (psVar8->field_1).value.first._M_str;
              (psVar8->field_1).value.first._M_len = local_48.first._M_len;
              (psVar8->field_1).value.first._M_str = local_48.first._M_str;
              pSVar1 = (psVar8->field_1).value.second;
              (psVar8->field_1).value.second = pSVar6;
              sVar4 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
                       )(cVar9 + '\x01');
              pSVar6 = pSVar1;
              local_48.first._M_len = sVar2;
              local_48.first._M_str = pcVar3;
            }
            else {
              sVar4 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>,4ul>>
                       )((char)sVar4 + '\x01');
              if (sVar4 == this[0x19]) {
                local_28 = local_48.first._M_len;
                pcStack_20 = local_48.first._M_str;
                sVar2 = (current_entry->field_1).value.first._M_len;
                pcVar3 = (current_entry->field_1).value.first._M_str;
                (current_entry->field_1).value.first._M_len = local_48.first._M_len;
                (current_entry->field_1).value.first._M_str = local_48.first._M_str;
                local_48.second = (current_entry->field_1).value.second;
                (current_entry->field_1).value.second = pSVar6;
                key = &local_48;
                local_48.first._M_len = sVar2;
                local_48.first._M_str = pcVar3;
                goto LAB_003c6217;
              }
            }
            cVar9 = psVar8[1].distance_from_desired;
            psVar7 = psVar8 + 1;
          } while (-1 < cVar9);
        }
        psVar8[1].field_1.value.second = pSVar6;
        psVar8[1].field_1.value.first._M_len = local_48.first._M_len;
        psVar8[1].field_1.value.first._M_str = local_48.first._M_str;
        psVar7->distance_from_desired = (int8_t)sVar4;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar12._9_7_ = (int7)((ulong)pSVar6 >> 8);
      pVar12.second = true;
      pVar12.first.current = current_entry;
      return pVar12;
    }
  }
LAB_003c6217:
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
  ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>_>,_4UL>_>
          *)this);
  pVar12 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>>
                     (this,key);
  return pVar12;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }